

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O1

void handlegraph::PathMetadata::parse_path_name
               (string *path_name,PathSense *sense,string *sample,string *locus,size_t *haplotype,
               size_t *phase_block,subrange_t *subrange)

{
  int iVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  char *pcVar2;
  bool bVar3;
  pointer psVar4;
  int *piVar5;
  size_t sVar6;
  unsigned_long uVar7;
  undefined8 uVar8;
  PathSense PVar9;
  long lVar10;
  pointer psVar11;
  smatch result;
  char *local_80;
  undefined8 local_78;
  char local_70;
  undefined7 uStack_6f;
  int local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  char *local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  __s._M_current = (path_name->_M_dataplus)._M_p;
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + path_name->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_58,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)FORMAT_abi_cxx11_,0);
  if (!bVar3) {
    *sense = GENERIC;
    std::__cxx11::string::_M_assign((string *)sample);
    std::__cxx11::string::_M_assign((string *)locus);
    *haplotype = 0xffffffffffffffff;
    *phase_block = 0xffffffffffffffff;
LAB_0013ea1d:
    *(undefined4 *)&subrange->first = 0xffffffff;
    *(undefined4 *)((long)&subrange->first + 4) = 0xffffffff;
    *(undefined4 *)&subrange->second = 0xffffffff;
    *(undefined4 *)((long)&subrange->second + 4) = 0xffffffff;
    goto LAB_0013ea2d;
  }
  if (local_58._0_8_ == local_58._8_8_) {
    bVar3 = false;
  }
  else {
    bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 8U <
            0xfffffffffffffffb;
  }
  psVar4 = (pointer)(local_58._8_8_ + -0x48);
  psVar11 = (pointer)(local_58._0_8_ + 0x60);
  if (!bVar3) {
    psVar11 = psVar4;
  }
  PVar9 = HAPLOTYPE;
  lVar10 = (long)(local_58._8_8_ - local_58._0_8_) >> 3;
  if (psVar11->matched == false) {
    psVar11 = (pointer)(local_58._0_8_ + 0x48);
    if (local_58._0_8_ == local_58._8_8_ || 0xfffffffffffffffb < lVar10 * -0x5555555555555555 - 7U)
    {
      psVar11 = psVar4;
    }
    PVar9 = REFERENCE;
    if (psVar11->matched == false) {
      psVar11 = (pointer)(local_58._0_8_ + 0x30);
      if (local_58._0_8_ == local_58._8_8_ || 0xfffffffffffffffc < lVar10 * -0x5555555555555555 - 6U
         ) {
        psVar11 = psVar4;
      }
      PVar9 = (PathSense)psVar11->matched;
    }
  }
  *sense = PVar9;
  psVar11 = psVar4;
  if (local_58._0_8_ != local_58._8_8_ && lVar10 * -0x5555555555555555 - 7U < 0xfffffffffffffffc) {
    psVar11 = (pointer)(local_58._0_8_ + 0x48);
  }
  if (psVar11->matched == true) {
    psVar11 = (pointer)(local_58._0_8_ + 0x30);
    if (local_58._0_8_ == local_58._8_8_ || 0xfffffffffffffffc < lVar10 * -0x5555555555555555 - 6U)
    {
      psVar11 = psVar4;
    }
    if (psVar11->matched != true) goto LAB_0013e3b8;
    if (local_58._0_8_ != local_58._8_8_ && lVar10 * -0x5555555555555555 - 5U < 0xfffffffffffffffe)
    {
      psVar4 = (pointer)(local_58._0_8_ + 0x18);
    }
    if (psVar4->matched == true) {
      local_80 = &local_70;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_80,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_80 = &local_70;
      local_78 = 0;
      local_70 = '\0';
    }
    std::__cxx11::string::operator=((string *)sample,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    if (local_58._0_8_ == local_58._8_8_) {
      bVar3 = false;
    }
    else {
      bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 7U <
              0xfffffffffffffffc;
    }
    psVar4 = (pointer)(local_58._8_8_ + -0x48);
    if (bVar3) {
      psVar4 = (pointer)(local_58._0_8_ + 0x48);
    }
    local_80 = &local_70;
    if (psVar4->matched == true) {
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_80,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_78 = 0;
      local_70 = '\0';
    }
    std::__cxx11::string::operator=((string *)locus,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    if (local_58._0_8_ == local_58._8_8_) {
      bVar3 = false;
    }
    else {
      bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 6U <
              0xfffffffffffffffd;
    }
    psVar4 = (pointer)(local_58._8_8_ + -0x48);
    if (bVar3) {
      psVar4 = (pointer)(local_58._0_8_ + 0x30);
    }
    if (psVar4->matched == true) {
      local_80 = &local_70;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_80,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_78 = 0;
      local_70 = '\0';
      local_80 = &local_70;
    }
    pcVar2 = local_80;
    piVar5 = __errno_location();
    local_5c = *piVar5;
    *piVar5 = 0;
    sVar6 = strtoll(pcVar2,&local_38,10);
    if (local_38 != pcVar2) {
      if (*piVar5 == 0) {
LAB_0013e71b:
        *piVar5 = local_5c;
      }
      else if (*piVar5 == 0x22) {
        sVar6 = std::__throw_out_of_range("stoll");
        goto LAB_0013e71b;
      }
      *haplotype = sVar6;
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      goto LAB_0013e87e;
    }
  }
  else {
LAB_0013e3b8:
    psVar11 = (pointer)(local_58._0_8_ + 0x30);
    if (local_58._0_8_ == local_58._8_8_ || 0xfffffffffffffffc < lVar10 * -0x5555555555555555 - 6U)
    {
      psVar11 = psVar4;
    }
    if (psVar11->matched == true) {
      if (local_58._0_8_ != local_58._8_8_ && lVar10 * -0x5555555555555555 - 5U < 0xfffffffffffffffe
         ) {
        psVar4 = (pointer)(local_58._0_8_ + 0x18);
      }
      if (psVar4->matched == true) {
        local_80 = &local_70;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_80,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_80 = &local_70;
        local_78 = 0;
        local_70 = '\0';
      }
      std::__cxx11::string::operator=((string *)sample,(string *)&local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      if (local_58._0_8_ == local_58._8_8_) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 6U <
                0xfffffffffffffffd;
      }
      psVar4 = (pointer)(local_58._8_8_ + -0x48);
      if (bVar3) {
        psVar4 = (pointer)(local_58._0_8_ + 0x30);
      }
      if (psVar4->matched != true) goto LAB_0013e83e;
      local_80 = &local_70;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_80,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      psVar11 = psVar4;
      if ((local_58._0_8_ != local_58._8_8_) &&
         (psVar11 = (pointer)(local_58._0_8_ + 0x48),
         0xfffffffffffffffb < lVar10 * -0x5555555555555555 - 7U)) {
        psVar11 = psVar4;
      }
      if (psVar11->matched == true) {
        if (local_58._0_8_ != local_58._8_8_ &&
            lVar10 * -0x5555555555555555 - 5U < 0xfffffffffffffffe) {
          psVar4 = (pointer)(local_58._0_8_ + 0x18);
        }
        if (psVar4->matched == true) {
          local_80 = &local_70;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_80,
                     (psVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_80 = &local_70;
          local_78 = 0;
          local_70 = '\0';
        }
        std::__cxx11::string::operator=((string *)sample,(string *)&local_80);
        if (local_80 != &local_70) {
          operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
        }
        if (local_58._0_8_ == local_58._8_8_) {
          bVar3 = false;
        }
        else {
          bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 7U <
                  0xfffffffffffffffc;
        }
        psVar4 = (pointer)(local_58._8_8_ + -0x48);
        if (bVar3) {
          psVar4 = (pointer)(local_58._0_8_ + 0x48);
        }
        if (psVar4->matched == true) {
          local_80 = &local_70;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_80,
                     (psVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar4->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
LAB_0013e83e:
          local_80 = &local_70;
          local_78 = 0;
          local_70 = '\0';
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)sample);
        if (local_58._0_8_ == local_58._8_8_) {
          bVar3 = false;
        }
        else {
          bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 5U <
                  0xfffffffffffffffe;
        }
        psVar4 = (pointer)(local_58._8_8_ + -0x48);
        if (bVar3) {
          psVar4 = (pointer)(local_58._0_8_ + 0x18);
        }
        local_80 = &local_70;
        if (psVar4->matched != true) goto LAB_0013e83e;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_80,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
    }
    std::__cxx11::string::operator=((string *)locus,(string *)&local_80);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    *haplotype = 0xffffffffffffffff;
LAB_0013e87e:
    if (local_58._0_8_ == local_58._8_8_) {
      bVar3 = false;
    }
    else {
      bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 8U <
              0xfffffffffffffffb;
    }
    psVar4 = (pointer)(local_58._8_8_ + -0x48);
    psVar11 = psVar4;
    if (bVar3) {
      psVar11 = (pointer)(local_58._0_8_ + 0x60);
    }
    if (psVar11->matched != true) {
      *phase_block = 0xffffffffffffffff;
LAB_0013e997:
      if (local_58._0_8_ == local_58._8_8_) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 9U <
                0xfffffffffffffffa;
      }
      psVar4 = (pointer)(local_58._8_8_ + -0x48);
      psVar11 = psVar4;
      if (bVar3) {
        psVar11 = (pointer)(local_58._0_8_ + 0x78);
      }
      if (psVar11->matched != true) goto LAB_0013ea1d;
      if ((local_58._0_8_ != local_58._8_8_) &&
         (((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 9U <
          0xfffffffffffffffa)) {
        psVar4 = (pointer)(local_58._0_8_ + 0x78);
      }
      if (psVar4->matched == true) {
        local_80 = &local_70;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_80,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_80 = &local_70;
        local_78 = 0;
        local_70 = '\0';
      }
      pcVar2 = local_80;
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      *piVar5 = 0;
      uVar7 = strtoll(pcVar2,&local_38,10);
      if (local_38 == pcVar2) goto LAB_0013ebfd;
      if (*piVar5 == 0) {
LAB_0013eab4:
        *piVar5 = iVar1;
      }
      else if (*piVar5 == 0x22) {
        uVar7 = std::__throw_out_of_range("stoll");
        goto LAB_0013eab4;
      }
      subrange->first = uVar7;
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      if (local_58._0_8_ == local_58._8_8_) {
        bVar3 = false;
      }
      else {
        bVar3 = ((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 10U <
                0xfffffffffffffff9;
      }
      psVar4 = (pointer)(local_58._8_8_ + -0x48);
      psVar11 = psVar4;
      if (bVar3) {
        psVar11 = (pointer)(local_58._0_8_ + 0x90);
      }
      if (psVar11->matched != true) {
        subrange->second = 0xffffffffffffffff;
        goto LAB_0013ea2d;
      }
      if ((local_58._0_8_ != local_58._8_8_) &&
         (((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 10U <
          0xfffffffffffffff9)) {
        psVar4 = (pointer)(local_58._0_8_ + 0x90);
      }
      local_80 = &local_70;
      if (psVar4->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_80,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar4->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_78 = 0;
        local_70 = '\0';
      }
      pcVar2 = local_80;
      iVar1 = *piVar5;
      *piVar5 = 0;
      uVar7 = strtoll(local_80,&local_38,10);
      if (local_38 == pcVar2) goto LAB_0013ec15;
      if (*piVar5 == 0) {
LAB_0013ebc3:
        *piVar5 = iVar1;
      }
      else if (*piVar5 == 0x22) {
        uVar7 = std::__throw_out_of_range("stoll");
        goto LAB_0013ebc3;
      }
      subrange->second = uVar7;
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
LAB_0013ea2d:
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,local_48._0_8_ - local_58._0_8_);
      }
      return;
    }
    if ((local_58._0_8_ != local_58._8_8_) &&
       (((long)(local_58._8_8_ - local_58._0_8_) >> 3) * -0x5555555555555555 - 8U <
        0xfffffffffffffffb)) {
      psVar4 = (pointer)(local_58._0_8_ + 0x60);
    }
    if (psVar4->matched == true) {
      local_80 = &local_70;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_80,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar4->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_80 = &local_70;
      local_78 = 0;
      local_70 = '\0';
    }
    pcVar2 = local_80;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    *piVar5 = 0;
    sVar6 = strtoll(pcVar2,&local_38,10);
    if (local_38 != pcVar2) {
      if (*piVar5 == 0) {
LAB_0013e973:
        *piVar5 = iVar1;
      }
      else if (*piVar5 == 0x22) {
        sVar6 = std::__throw_out_of_range("stoll");
        goto LAB_0013e973;
      }
      *phase_block = sVar6;
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      goto LAB_0013e997;
    }
    std::__throw_invalid_argument("stoll");
LAB_0013ebfd:
    std::__throw_invalid_argument("stoll");
  }
  std::__throw_invalid_argument("stoll");
LAB_0013ec15:
  uVar8 = std::__throw_invalid_argument("stoll");
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ - local_58._0_8_);
  }
  _Unwind_Resume(uVar8);
}

Assistant:

void PathMetadata::parse_path_name(const std::string& path_name,
                                   PathSense& sense,
                                   std::string& sample,
                                   std::string& locus,
                                   size_t& haplotype,
                                   size_t& phase_block,
                                   subrange_t& subrange) {

    std::smatch result;
    auto matched = std::regex_match(path_name, result, FORMAT);
    
    // Parse out each piece.
    // TODO: can we unify this with the other places we parse out from the
    // regex? With yet a third set of functions?
    if (matched) {
        if (result[PHASE_BLOCK_MATCH].matched) {
            // It's a haplotype because it has a phase block.
            sense = PathSense::HAPLOTYPE;
        } else if (result[LOCUS_MATCH_ANY].matched || result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].matched) {
            // It's a reference because it has a locus and a sample
            sense = PathSense::REFERENCE;
        } else {
            // It's just a one-piece generic name
            sense = PathSense::GENERIC;
        }
        
        if (result[LOCUS_MATCH_ANY].matched && result[HAPLOTYPE_MATCH].matched) {
            // There's a haplotype and a locus and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_ANY].str();
            haplotype = std::stoll(result[HAPLOTYPE_MATCH].str());
        } else if (result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].matched) {
            // There's a numerical locus but no haplotype, and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].str();
            haplotype = NO_HAPLOTYPE;
        } else if (result[LOCUS_MATCH_ANY].matched) {
            // There's a non-numerical locus but no haplotype, and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_ANY].str();
            haplotype = NO_HAPLOTYPE;
        } else {
            // There's nothing but the locus and maybe a range.
            sample = NO_SAMPLE_NAME;
            locus = result[ASSEMBLY_OR_NAME_MATCH].str();
            haplotype = NO_HAPLOTYPE;
        }
        
        if (result[PHASE_BLOCK_MATCH].matched) {
            // There's a phase block.
            // We know it is a number.
            phase_block = std::stoll(result[PHASE_BLOCK_MATCH].str());
        } else {
            // No phase block is stored
            phase_block = NO_PHASE_BLOCK;
        }
        
        if (result[RANGE_START_MATCH].matched) {
            // There is a range start, so pasre it
            subrange.first = std::stoll(result[RANGE_START_MATCH].str());
            if (result[RANGE_END_MATCH].matched) {
                // There is also an end, so parse that too
                subrange.second = std::stoll(result[RANGE_END_MATCH].str());
            } else {
                subrange.second = NO_END_POSITION;
            }
        } else {
            subrange = NO_SUBRANGE;
        }
    } else {
        // Just a generic path where the locus is all of it.
        sense = PathSense::GENERIC;
        sample = NO_SAMPLE_NAME;
        locus = path_name;
        haplotype = NO_HAPLOTYPE;
        phase_block = NO_PHASE_BLOCK;
        subrange = NO_SUBRANGE;
    }
}